

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

RK_S32 mpi_enc_opt_o(void *ctx,char *next)

{
  size_t sVar1;
  char *__dest;
  RK_S32 RVar2;
  
  if (next == (char *)0x0) {
    RVar2 = 0;
    _mpp_log_l(4,"mpi_enc_utils","output file is invalid\n",0);
  }
  else {
    sVar1 = strnlen(next,0x100);
    RVar2 = 1;
    if (sVar1 != 0) {
      __dest = (char *)mpp_osal_calloc("mpi_enc_opt_o",sVar1 + 1);
      *(char **)((long)ctx + 8) = __dest;
      strcpy(__dest,next);
      name_to_coding_type(*(char **)((long)ctx + 8),(MppCodingType *)((long)ctx + 0x20));
    }
  }
  return RVar2;
}

Assistant:

RK_S32 mpi_enc_opt_o(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        size_t len = strnlen(next, MAX_FILE_NAME_LENGTH);
        if (len) {
            cmd->file_output = mpp_calloc(char, len + 1);
            strcpy(cmd->file_output, next);
            name_to_coding_type(cmd->file_output, &cmd->type);
        }

        return 1;
    }

    mpp_log("output file is invalid\n");
    return 0;
}